

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O2

CURLcode imap_dophase_done(connectdata *conn,_Bool connected)

{
  int *piVar1;
  CURLcode extraout_EAX;
  
  piVar1 = (int *)(conn->data->req).protop;
  if (*piVar1 != 0) {
    Curl_setup_transfer(conn->data,-1,-1,false,-1);
    return extraout_EAX;
  }
  return (CURLcode)piVar1;
}

Assistant:

static CURLcode imap_dophase_done(struct connectdata *conn, bool connected)
{
  struct IMAP *imap = conn->data->req.protop;

  (void)connected;

  if(imap->transfer != FTPTRANSFER_BODY)
    /* no data to transfer */
    Curl_setup_transfer(conn->data, -1, -1, FALSE, -1);

  return CURLE_OK;
}